

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddr.c
# Opt level: O0

int netaddr_socket_init(netaddr_socket *combined,netaddr *addr,uint16_t port,uint if_index)

{
  uint16_t uVar1;
  uint if_index_local;
  uint16_t port_local;
  netaddr *addr_local;
  netaddr_socket *combined_local;
  
  ((char *)((long)combined + 2))[0x6e] = '\0';
  ((char *)((long)combined + 2))[0x6f] = '\0';
  ((char *)((long)combined + 2))[0x70] = '\0';
  ((char *)((long)combined + 2))[0x71] = '\0';
  ((char *)((long)combined + 2))[0x72] = '\0';
  ((char *)((long)combined + 2))[0x73] = '\0';
  ((char *)((long)combined + 2))[0x74] = '\0';
  ((char *)((long)combined + 2))[0x75] = '\0';
  (combined->storage).__ss_align = 0;
  ((char *)((long)combined + 2))[0x5e] = '\0';
  ((char *)((long)combined + 2))[0x5f] = '\0';
  ((char *)((long)combined + 2))[0x60] = '\0';
  ((char *)((long)combined + 2))[0x61] = '\0';
  ((char *)((long)combined + 2))[0x62] = '\0';
  ((char *)((long)combined + 2))[99] = '\0';
  ((char *)((long)combined + 2))[100] = '\0';
  ((char *)((long)combined + 2))[0x65] = '\0';
  ((char *)((long)combined + 2))[0x66] = '\0';
  ((char *)((long)combined + 2))[0x67] = '\0';
  ((char *)((long)combined + 2))[0x68] = '\0';
  ((char *)((long)combined + 2))[0x69] = '\0';
  ((char *)((long)combined + 2))[0x6a] = '\0';
  ((char *)((long)combined + 2))[0x6b] = '\0';
  ((char *)((long)combined + 2))[0x6c] = '\0';
  ((char *)((long)combined + 2))[0x6d] = '\0';
  ((char *)((long)combined + 2))[0x4e] = '\0';
  ((char *)((long)combined + 2))[0x4f] = '\0';
  ((char *)((long)combined + 2))[0x50] = '\0';
  ((char *)((long)combined + 2))[0x51] = '\0';
  ((char *)((long)combined + 2))[0x52] = '\0';
  ((char *)((long)combined + 2))[0x53] = '\0';
  ((char *)((long)combined + 2))[0x54] = '\0';
  ((char *)((long)combined + 2))[0x55] = '\0';
  ((char *)((long)combined + 2))[0x56] = '\0';
  ((char *)((long)combined + 2))[0x57] = '\0';
  ((char *)((long)combined + 2))[0x58] = '\0';
  ((char *)((long)combined + 2))[0x59] = '\0';
  ((char *)((long)combined + 2))[0x5a] = '\0';
  ((char *)((long)combined + 2))[0x5b] = '\0';
  ((char *)((long)combined + 2))[0x5c] = '\0';
  ((char *)((long)combined + 2))[0x5d] = '\0';
  ((char *)((long)combined + 2))[0x3e] = '\0';
  ((char *)((long)combined + 2))[0x3f] = '\0';
  ((char *)((long)combined + 2))[0x40] = '\0';
  ((char *)((long)combined + 2))[0x41] = '\0';
  ((char *)((long)combined + 2))[0x42] = '\0';
  ((char *)((long)combined + 2))[0x43] = '\0';
  ((char *)((long)combined + 2))[0x44] = '\0';
  ((char *)((long)combined + 2))[0x45] = '\0';
  ((char *)((long)combined + 2))[0x46] = '\0';
  ((char *)((long)combined + 2))[0x47] = '\0';
  ((char *)((long)combined + 2))[0x48] = '\0';
  ((char *)((long)combined + 2))[0x49] = '\0';
  ((char *)((long)combined + 2))[0x4a] = '\0';
  ((char *)((long)combined + 2))[0x4b] = '\0';
  ((char *)((long)combined + 2))[0x4c] = '\0';
  ((char *)((long)combined + 2))[0x4d] = '\0';
  ((char *)((long)combined + 2))[0x2e] = '\0';
  ((char *)((long)combined + 2))[0x2f] = '\0';
  ((char *)((long)combined + 2))[0x30] = '\0';
  ((char *)((long)combined + 2))[0x31] = '\0';
  ((char *)((long)combined + 2))[0x32] = '\0';
  ((char *)((long)combined + 2))[0x33] = '\0';
  ((char *)((long)combined + 2))[0x34] = '\0';
  ((char *)((long)combined + 2))[0x35] = '\0';
  ((char *)((long)combined + 2))[0x36] = '\0';
  ((char *)((long)combined + 2))[0x37] = '\0';
  ((char *)((long)combined + 2))[0x38] = '\0';
  ((char *)((long)combined + 2))[0x39] = '\0';
  ((char *)((long)combined + 2))[0x3a] = '\0';
  ((char *)((long)combined + 2))[0x3b] = '\0';
  ((char *)((long)combined + 2))[0x3c] = '\0';
  ((char *)((long)combined + 2))[0x3d] = '\0';
  ((char *)((long)combined + 2))[0x1e] = '\0';
  ((char *)((long)combined + 2))[0x1f] = '\0';
  ((char *)((long)combined + 2))[0x20] = '\0';
  ((char *)((long)combined + 2))[0x21] = '\0';
  ((char *)((long)combined + 2))[0x22] = '\0';
  ((char *)((long)combined + 2))[0x23] = '\0';
  ((char *)((long)combined + 2))[0x24] = '\0';
  ((char *)((long)combined + 2))[0x25] = '\0';
  ((char *)((long)combined + 2))[0x26] = '\0';
  ((char *)((long)combined + 2))[0x27] = '\0';
  ((char *)((long)combined + 2))[0x28] = '\0';
  ((char *)((long)combined + 2))[0x29] = '\0';
  ((char *)((long)combined + 2))[0x2a] = '\0';
  ((char *)((long)combined + 2))[0x2b] = '\0';
  ((char *)((long)combined + 2))[0x2c] = '\0';
  ((char *)((long)combined + 2))[0x2d] = '\0';
  *(undefined8 *)((long)&(combined->v6).sin6_addr.__in6_u + 8) = 0;
  *(undefined8 *)&(combined->v6).sin6_scope_id = 0;
  *(undefined8 *)combined = 0;
  ((uchar *)((long)combined + 8))[0] = '\0';
  ((uchar *)((long)combined + 8))[1] = '\0';
  ((uchar *)((long)combined + 8))[2] = '\0';
  ((uchar *)((long)combined + 8))[3] = '\0';
  ((uchar *)((long)combined + 8))[4] = '\0';
  ((uchar *)((long)combined + 8))[5] = '\0';
  ((uchar *)((long)combined + 8))[6] = '\0';
  ((uchar *)((long)combined + 8))[7] = '\0';
  if (addr->_type == '\x02') {
    (combined->v4).sin_addr.s_addr = *(in_addr_t *)addr->_addr;
    uVar1 = htons(port);
    (combined->v4).sin_port = uVar1;
  }
  else {
    if (addr->_type != '\n') {
      return -1;
    }
    *(undefined8 *)(combined->v4).sin_zero = *(undefined8 *)addr->_addr;
    *(undefined8 *)((long)&(combined->v6).sin6_addr.__in6_u + 8) = *(undefined8 *)(addr->_addr + 8);
    uVar1 = htons(port);
    (combined->v4).sin_port = uVar1;
    (combined->v6).sin6_scope_id = if_index;
  }
  *(ushort *)combined = (ushort)addr->_type;
  return 0;
}

Assistant:

int
netaddr_socket_init(union netaddr_socket *combined, const struct netaddr *addr, uint16_t port, unsigned if_index) {
  /* initialize memory block */
  memset(combined, 0, sizeof(*combined));

  switch (addr->_type) {
    case AF_INET:
      /* ipv4 */
      memcpy(&combined->v4.sin_addr, addr->_addr, 4);
      combined->v4.sin_port = htons(port);
      break;
    case AF_INET6:
      /* ipv6 */
      memcpy(&combined->v6.sin6_addr, addr->_addr, 16);
      combined->v6.sin6_port = htons(port);
      combined->v6.sin6_scope_id = if_index;
      break;
    default:
      /* unknown address type */
      return -1;
  }

  /* copy address type */
  combined->std.sa_family = addr->_type;
  return 0;
}